

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O2

void __thiscall QBoxLayout::addStrut(QBoxLayout *this,int size)

{
  long lVar1;
  bool bVar2;
  QSpacerItem *pQVar3;
  parameter_type t;
  int h;
  int w;
  
  lVar1 = *(long *)&(this->super_QLayout).field_0x8;
  bVar2 = 1 < *(uint *)(lVar1 + 0x11c);
  if (bVar2) {
    h = 0;
    w = size;
  }
  else {
    w = 0;
    h = size;
  }
  pQVar3 = QLayoutPrivate::createSpacerItem(&this->super_QLayout,w,h,(uint)bVar2,(uint)!bVar2);
  t = (parameter_type)operator_new(0x10);
  t->item = &pQVar3->super_QLayoutItem;
  t->stretch = 0;
  t->magic = true;
  QList<QBoxLayoutItem_*>::append((QList<QBoxLayoutItem_*> *)(lVar1 + 0xb0),t);
  (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
  return;
}

Assistant:

void QBoxLayout::addStrut(int size)
{
    Q_D(QBoxLayout);
    QLayoutItem *b;
    if (horz(d->dir))
        b = QLayoutPrivate::createSpacerItem(this, 0, size, QSizePolicy::Fixed, QSizePolicy::Minimum);
    else
        b = QLayoutPrivate::createSpacerItem(this, size, 0, QSizePolicy::Minimum, QSizePolicy::Fixed);

    QBoxLayoutItem *it = new QBoxLayoutItem(b);
    it->magic = true;
    d->list.append(it);
    invalidate();
}